

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

size_t io::net::write<io::posix::file,io::net::const_buffer,io::net::transfer_all,void>
                 (file *stream,const_buffer *buffers,error_code *param_3)

{
  size_t sVar1;
  size_t sVar2;
  size_t buf_size;
  size_t next_write_size;
  size_t total_bytes_written;
  error_code *ec_local;
  const_buffer *buffers_local;
  file *stream_local;
  
  std::error_code::clear(param_3);
  next_write_size = 0;
  buf_size = 0x10000;
  sVar1 = buffer_size(buffers);
  while (next_write_size < sVar1 && buf_size != 0) {
    sVar2 = posix::file::write_some(stream,buffers,param_3);
    next_write_size = sVar2 + next_write_size;
    buf_size = transfer_all::operator()
                         ((transfer_all *)((long)&stream_local + 7),param_3,next_write_size);
  }
  return next_write_size;
}

Assistant:

std::size_t write(SyncWriteStream& stream,
                  const ConstBufferSequence& buffers,
                  CompletionCondition completion_condition,
                  std::error_code& ec)
{
    ec.clear();

    std::size_t total_bytes_written = 0;
    std::size_t next_write_size = max_single_transfer_size;
    std::size_t buf_size = buffer_size(buffers);

    while (total_bytes_written < buf_size && next_write_size != 0) {
        total_bytes_written += stream.write_some(buffers, ec);
        next_write_size = completion_condition(ec, total_bytes_written);
    }

    return total_bytes_written;
}